

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

bool __thiscall QWidget::restoreGeometry(QWidget *this,QByteArray *geometry)

{
  QWidgetPrivate *this_00;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var1;
  double dVar2;
  QFlagsStorage<Qt::WindowState> newstate;
  QRect QVar3;
  QRect QVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  QDataStream *pQVar8;
  QStyle *pQVar9;
  undefined8 uVar10;
  QSize QVar11;
  P _a;
  int extraout_EDX;
  bool bVar12;
  QRect *r;
  Representation RVar13;
  Representation RVar14;
  ulong uVar15;
  long lVar16;
  long in_FS_OFFSET;
  qint32 restoredScreenWidth;
  quint8 fullScreen;
  quint8 maximized;
  qint32 restoredScreenNumber;
  quint16 minorVersion;
  quint16 majorVersion;
  quint32 storedMagicNumber;
  undefined1 local_c8 [16];
  ulong local_b8;
  int local_a4;
  char local_9e;
  char local_9d;
  int local_9c;
  QRect local_98;
  QRect local_88;
  QRect local_78;
  short local_60;
  ushort local_5e;
  int local_5c;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)(geometry->d).size < 4) {
    bVar12 = false;
    goto LAB_00308ff9;
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,geometry);
  puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,7);
  local_5c = -0x55555556;
  QDataStream::operator>>((QDataStream *)&local_58,&local_5c);
  if (local_5c == 0x1d9d0cb) {
    bVar12 = false;
    local_5e = 0;
    local_60 = 0;
    pQVar8 = (QDataStream *)QDataStream::operator>>((QDataStream *)&local_58,(short *)&local_5e);
    QDataStream::operator>>(pQVar8,&local_60);
    QVar3.x2.m_i = local_c8._8_4_;
    QVar3.y2.m_i = local_c8._12_4_;
    QVar3.x1.m_i = local_c8._0_4_;
    QVar3.y1.m_i = local_c8._4_4_;
    if (local_5e < 4) {
      local_78.x1.m_i = 0;
      local_78.y1.m_i = 0;
      local_78.x2.m_i = -1;
      local_78.y2.m_i = -1;
      local_88.x1.m_i = 0;
      local_88.y1.m_i = 0;
      local_88.x2.m_i = -1;
      local_88.y2.m_i = -1;
      local_98.x1.m_i = 0;
      local_98.y1.m_i = 0;
      local_98.x2.m_i = -1;
      local_98.y2.m_i = -1;
      local_9c = -0x55555556;
      local_9d = -0x56;
      local_9e = -0x56;
      local_a4 = 0;
      pQVar8 = (QDataStream *)::operator>>((QDataStream *)&local_58,&local_78);
      pQVar8 = (QDataStream *)::operator>>(pQVar8,&local_98);
      pQVar8 = (QDataStream *)QDataStream::operator>>(pQVar8,&local_9c);
      pQVar8 = (QDataStream *)QDataStream::operator>>(pQVar8,&local_9d);
      QDataStream::operator>>(pQVar8,&local_9e);
      if (1 < local_5e) {
        QDataStream::operator>>((QDataStream *)&local_58,&local_a4);
      }
      if (2 < local_5e) {
        ::operator>>((QDataStream *)&local_58,&local_88);
      }
      lVar16 = (long)local_9c;
      QGuiApplication::screens();
      uVar15 = 1;
      if (1 < (long)local_b8) {
        uVar15 = local_b8;
      }
      if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,8,0x10);
        }
      }
      if ((long)uVar15 <= lVar16) {
        local_9c = 0;
      }
      QGuiApplication::screens();
      if ((ulong)(long)local_9c < local_b8) {
        lVar16 = *(long *)(local_c8._8_8_ + (long)local_9c * 8);
      }
      else {
        lVar16 = 0;
      }
      if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,8,0x10);
        }
      }
      if (lVar16 == 0) {
        dVar2 = 0.0;
      }
      else {
        iVar5 = QScreen::geometry();
        dVar2 = (double)((extraout_EDX - iVar5) + 1);
      }
      QVar4.x2.m_i = local_c8._8_4_;
      QVar4.y2.m_i = local_c8._12_4_;
      QVar4.x1.m_i = local_c8._0_4_;
      QVar4.y1.m_i = local_c8._4_4_;
      QVar3.x2.m_i = local_c8._8_4_;
      QVar3.y2.m_i = local_c8._12_4_;
      QVar3.x1.m_i = local_c8._0_4_;
      QVar3.y1.m_i = local_c8._4_4_;
      if (local_a4 == 0) {
        if (local_9e == '\0' && local_9d == '\0') {
          if (1.5 < (double)((local_78.x2.m_i - local_78.x1.m_i) + 1) / dVar2) goto LAB_00308e32;
        }
      }
      else {
        bVar12 = false;
        if (((double)local_a4 / dVar2 < 0.8) || (QVar3 = QVar4, 1.25 < (double)local_a4 / dVar2))
        goto LAB_00308fef;
      }
      pQVar9 = QApplication::style();
      if (pQVar9 == (QStyle *)0x0) {
        uVar6 = 0x14;
      }
      else {
        pQVar9 = QApplication::style();
        uVar6 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x1a,0,this);
      }
      if (local_98.x2.m_i < local_98.x1.m_i) {
LAB_00308e7e:
        uVar10 = (**(code **)(*(long *)this + 0x70))(this);
        local_98._0_8_ = (ulong)uVar6 << 0x20;
        local_98.y2.m_i = (int)((ulong)uVar10 >> 0x20) + uVar6 + -1;
        local_98.x2.m_i = (int)uVar10 + -1;
      }
      else if (local_98.y2.m_i < local_98.y1.m_i) goto LAB_00308e7e;
      if (local_98.x2.m_i < local_98.x1.m_i || local_98.y2.m_i < local_98.y1.m_i) {
        RVar13.m_i = (local_98.x2.m_i - local_98.x1.m_i) + 1;
        RVar14.m_i = (local_98.y2.m_i - local_98.y1.m_i) + 1;
        QVar11 = QWidgetPrivate::adjustedSize(*(QWidgetPrivate **)&this->field_0x8);
        if (RVar13.m_i <= QVar11.wd.m_i.m_i) {
          RVar13.m_i = QVar11.wd.m_i.m_i;
        }
        if (RVar14.m_i <= QVar11.ht.m_i.m_i) {
          RVar14.m_i = QVar11.ht.m_i.m_i;
        }
        local_98.y2.m_i = local_98.y1.m_i + RVar14.m_i + -1;
        local_98.x2.m_i = local_98.x1.m_i + -1 + RVar13.m_i;
      }
      local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      if (lVar16 == 0) {
        local_c8 = ZEXT816(0xffffffffffffffff) << 0x40;
      }
      else {
        local_c8 = QScreen::availableGeometry();
      }
      QWidgetPrivate::checkRestoredGeometry((QRect *)local_c8,&local_88,uVar6);
      QWidgetPrivate::checkRestoredGeometry((QRect *)local_c8,&local_98,uVar6);
      uVar6 = *(uint *)&this->data->field_0x10;
      if (local_9e == '\0' && local_9d == '\0') {
        setWindowState(this,(WindowStates)(uVar6 & 9));
        if (local_5e < 3) {
          r = &local_98;
        }
        else {
          r = &local_88;
        }
        setGeometry(this,r);
      }
      else {
        uVar6 = uVar6 & 0xf;
        setGeometry(this,&local_98);
        uVar7 = uVar6 | 2;
        if (local_9d == '\0') {
          uVar7 = uVar6;
        }
        newstate.i = uVar7 | 4;
        if (local_9e == '\0') {
          newstate.i = uVar7;
        }
        setWindowState(this,(WindowStates)newstate.i);
        this_00 = *(QWidgetPrivate **)&this->field_0x8;
        QWidgetPrivate::createTLExtra(this_00);
        _Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
        super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
             (((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
               _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
             super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
        *(undefined8 *)
         ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa0) = local_98._0_8_;
        *(undefined8 *)
         ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa8) = local_98._8_8_;
      }
      bVar12 = true;
      QVar3 = (QRect)local_c8;
    }
  }
  else {
LAB_00308e32:
    QVar3.x2.m_i = local_c8._8_4_;
    QVar3.y2.m_i = local_c8._12_4_;
    QVar3.x1.m_i = local_c8._0_4_;
    QVar3.y1.m_i = local_c8._4_4_;
    bVar12 = false;
  }
LAB_00308fef:
  local_c8 = (undefined1  [16])QVar3;
  QDataStream::~QDataStream((QDataStream *)&local_58);
LAB_00308ff9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar12;
}

Assistant:

bool QWidget::restoreGeometry(const QByteArray &geometry)
{
    if (geometry.size() < 4)
        return false;
    QDataStream stream(geometry);
    stream.setVersion(QDataStream::Qt_4_0);

    const quint32 magicNumber = 0x1D9D0CB;
    quint32 storedMagicNumber;
    stream >> storedMagicNumber;
    if (storedMagicNumber != magicNumber)
        return false;

    const quint16 currentMajorVersion = 3;
    quint16 majorVersion = 0;
    quint16 minorVersion = 0;

    stream >> majorVersion >> minorVersion;

    if (majorVersion > currentMajorVersion)
        return false;
    // (Allow all minor versions.)

    QRect restoredFrameGeometry;
    QRect restoredGeometry;
    QRect restoredNormalGeometry;
    qint32 restoredScreenNumber;
    quint8 maximized;
    quint8 fullScreen;
    qint32 restoredScreenWidth = 0;

    stream >> restoredFrameGeometry // Only used for sanity checks in version 0
           >> restoredNormalGeometry
           >> restoredScreenNumber
           >> maximized
           >> fullScreen;

    if (majorVersion > 1)
        stream >> restoredScreenWidth;
    if (majorVersion > 2)
        stream >> restoredGeometry;

    // ### Qt 6 - Perhaps it makes sense to dumb down the restoreGeometry() logic, see QTBUG-69104

    if (restoredScreenNumber >= qMax(QGuiApplication::screens().size(), 1))
        restoredScreenNumber = 0;
    const QScreen *restoredScreen = QGuiApplication::screens().value(restoredScreenNumber, nullptr);
    const qreal screenWidthF = restoredScreen ? qreal(restoredScreen->geometry().width()) : 0;
    // Sanity check bailing out when large variations of screen sizes occur due to
    // high DPI scaling or different levels of DPI awareness.
    if (restoredScreenWidth) {
        const qreal factor = qreal(restoredScreenWidth) / screenWidthF;
        if (factor < 0.8 || factor > 1.25)
            return false;
    } else {
        // Saved by Qt 5.3 and earlier, try to prevent too large windows
        // unless the size will be adapted by maximized or fullscreen.
        if (!maximized && !fullScreen && qreal(restoredFrameGeometry.width()) / screenWidthF > 1.5)
            return false;
    }

    const int frameHeight = QApplication::style()
                          ? QApplication::style()->pixelMetric(QStyle::PM_TitleBarHeight, nullptr, this)
                          : 20;

    if (!restoredNormalGeometry.isValid())
        restoredNormalGeometry = QRect(QPoint(0, frameHeight), sizeHint());
    if (!restoredNormalGeometry.isValid()) {
        // use the widget's adjustedSize if the sizeHint() doesn't help
        restoredNormalGeometry.setSize(restoredNormalGeometry
                                       .size()
                                       .expandedTo(d_func()->adjustedSize()));
    }

    const QRect availableGeometry = restoredScreen ? restoredScreen->availableGeometry()
                                                   : QRect();

    // Modify the restored geometry if we are about to restore to coordinates
    // that would make the window "lost". This happens if:
    // - The restored geometry is completely or partly oustside the available geometry
    // - The title bar is outside the available geometry.

    QWidgetPrivate::checkRestoredGeometry(availableGeometry, &restoredGeometry, frameHeight);
    QWidgetPrivate::checkRestoredGeometry(availableGeometry, &restoredNormalGeometry, frameHeight);

    if (maximized || fullScreen) {
        // set geometry before setting the window state to make
        // sure the window is maximized to the right screen.
        Qt::WindowStates ws = windowState();
#ifndef Q_OS_WIN
        setGeometry(restoredNormalGeometry);
#else
        if (ws & Qt::WindowFullScreen) {
            // Full screen is not a real window state on Windows.
            move(availableGeometry.topLeft());
        } else if (ws & Qt::WindowMaximized) {
            // Setting a geometry on an already maximized window causes this to be
            // restored into a broken, half-maximized state, non-resizable state (QTBUG-4397).
            // Move the window in normal state if needed.
            if (restoredScreen != screen()) {
                setWindowState(Qt::WindowNoState);
                setGeometry(restoredNormalGeometry);
            }
        } else {
            setGeometry(restoredNormalGeometry);
        }
#endif // Q_OS_WIN
        if (maximized)
            ws |= Qt::WindowMaximized;
        if (fullScreen)
            ws |= Qt::WindowFullScreen;
       setWindowState(ws);
       d_func()->topData()->normalGeometry = restoredNormalGeometry;
    } else {
        setWindowState(windowState() & ~(Qt::WindowMaximized | Qt::WindowFullScreen));

        // FIXME: Why fall back to restoredNormalGeometry if majorVersion <= 2?
        if (majorVersion > 2)
            setGeometry(restoredGeometry);
        else
            setGeometry(restoredNormalGeometry);
    }
    return true;
}